

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrained_type.cpp
# Opt level: O0

int * test_verifier::verify<int_const&,test_predicate>(int *value,test_predicate *p)

{
  bool value_00;
  Decomposer local_ba;
  ExprLhs<bool> local_b9;
  BinaryExpr<bool,_bool> local_b8;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  AssertionHandler catchAssertionHandler;
  test_predicate *p_local;
  int *value_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)p;
  local_70 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/constrained_type.cpp"
             ,0x12);
  Catch::StringRef::StringRef(&local_90,"p(value) == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_60,&local_70,&local_80,local_90,Normal);
  value_00 = test_predicate::operator()
                       ((test_predicate *)catchAssertionHandler.m_resultCapture,*value);
  local_b9 = Catch::Decomposer::operator<=(&local_ba,value_00);
  Catch::ExprLhs<bool>::operator==(&local_b8,&local_b9,(bool)(expected & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_60,&local_b8.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_60);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_60);
  return value;
}

Assistant:

static T&& verify(T&& value, const Predicate& p)
    {
        REQUIRE(p(value) == expected);
        return std::forward<T>(value);
    }